

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist.h
# Opt level: O2

Statistic * __thiscall LinkList<Statistic>::Get(LinkList<Statistic> *this,int index)

{
  uint uVar1;
  InternalNode *pIVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  InternalNode **ppIVar8;
  uint uVar9;
  int iVar10;
  bool bVar11;
  
  if ((index < 0) || (uVar1 = this->iLength, (int)uVar1 <= index)) {
    return (Statistic *)0x0;
  }
  uVar4 = index + 1;
  uVar5 = this->iLastRef;
  if (uVar5 == 0xffffffff) {
    iVar10 = uVar1 - uVar4;
    bVar11 = SBORROW4(uVar4,iVar10);
    iVar3 = uVar4 - iVar10;
    lVar7 = (ulong)(iVar10 <= (int)uVar4) * 8 + 8;
    uVar5 = 1;
  }
  else {
    uVar9 = uVar4 - uVar5;
    uVar6 = -uVar9;
    if (0 < (int)uVar9) {
      uVar6 = uVar9;
    }
    if (uVar4 < uVar6) {
      lVar7 = 8;
      uVar5 = 1;
      goto LAB_001055b1;
    }
    iVar10 = uVar1 - uVar4;
    bVar11 = SBORROW4(uVar6,iVar10);
    iVar3 = uVar6 - iVar10;
    lVar7 = (ulong)((int)uVar6 < iVar10) * 8 + 0x10;
  }
  if (bVar11 == iVar3 < 0) {
    uVar5 = uVar1;
  }
LAB_001055b1:
  ppIVar8 = (InternalNode **)((long)&this->iLength + lVar7);
  while( true ) {
    pIVar2 = *ppIVar8;
    if (uVar5 == uVar4) break;
    ppIVar8 = &pIVar2->next + (index < (int)uVar5);
    uVar5 = uVar5 + (-(uint)(index < (int)uVar5) | 1);
  }
  this->iLastRef = uVar4;
  this->pnLastRef = pIVar2;
  return &pIVar2->Data;
}

Assistant:

inline T* LinkList<T>::Get(int index)
{
	int iCur;               // Position to start search from
	InternalNode *pnTemp;   // Node to start search from
	int iRelToMiddle;       // Position asked for relative to last ref

   // Make sure that item is within bounds
	if (index < 0 || index >= iLength)
		return NULL;

   // Having the index be base 1 makes this procedure much easier.
   index++;

	if (iLastRef==-1)
		if (index < (iLength-index)) {
			iCur = 1;
			pnTemp = pnHead;
		} else {
			iCur = iLength;
			pnTemp = pnTail;
		}
	else
		{
			if (index < iLastRef)
				iRelToMiddle = iLastRef - index;
			else
				iRelToMiddle = index - iLastRef;

			if (index < iRelToMiddle) {
				// The head is closest to requested element
				iCur = 1;
				pnTemp = pnHead;
			}
			else
				if (iRelToMiddle < (iLength - index)) {
					iCur = iLastRef;
					pnTemp = pnLastRef;
				} else {
					iCur = iLength;
					pnTemp = pnTail;
				}
		}

	// Now starting from the decided upon first element
	// find the desired element
	while (iCur != index)
		if (iCur < index) {
			iCur++;
			pnTemp = pnTemp->next;
		} else {
			iCur--;
			pnTemp = pnTemp->previous;
		}

	iLastRef = index;
	pnLastRef = pnTemp;

   return &(pnLastRef->Data);
}